

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer-a3.cpp
# Opt level: O1

void __thiscall
RasterizerA3<4u>::_renderImpl<CompositorSIMD,true>(RasterizerA3<4u> *this,uint32_t argb32)

{
  int *piVar1;
  char *pcVar2;
  int *piVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  int iVar25;
  ulong uVar26;
  uint uVar27;
  uint uVar28;
  long lVar29;
  ulong uVar30;
  ulong uVar31;
  ulong *puVar32;
  undefined1 auVar33 [16];
  short sVar34;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  undefined1 in_XMM1 [16];
  undefined1 auVar35 [16];
  short sVar42;
  undefined1 in_XMM2 [16];
  undefined1 auVar43 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar44 [16];
  short sVar45;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  undefined1 in_XMM6 [16];
  undefined1 auVar46 [16];
  short sVar53;
  undefined1 in_XMM8 [16];
  undefined1 auVar54 [16];
  short sVar55;
  short sVar57;
  short sVar58;
  short sVar59;
  short sVar60;
  short sVar61;
  short sVar62;
  uint uVar63;
  short sVar64;
  undefined1 auVar56 [16];
  short sVar65;
  uint uVar66;
  ushort uVar78;
  ushort uVar79;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  short sVar77;
  undefined1 auVar71 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  short sVar80;
  short sVar81;
  short sVar87;
  short sVar89;
  short sVar91;
  short sVar93;
  short sVar95;
  short sVar97;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  short sVar99;
  undefined1 auVar85 [16];
  short sVar88;
  short sVar90;
  short sVar92;
  short sVar94;
  short sVar96;
  short sVar98;
  short sVar100;
  undefined1 auVar86 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  int iVar108;
  int iVar110;
  undefined1 in_XMM13 [16];
  int iVar109;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 in_XMM15 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar67 [12];
  undefined1 auVar72 [16];
  undefined1 auVar70 [16];
  undefined1 auVar73 [16];
  
  auVar15 = _DAT_00112190;
  auVar14 = _DAT_00112160;
  uVar31 = (ulong)(int)*(uint *)(this + 0x40);
  uVar4 = *(uint *)(this + 0x44);
  if (*(uint *)(this + 0x40) <= uVar4) {
    lVar5 = *(long *)(*(long *)(this + 8) + 8);
    iVar25 = (argb32 & 0xff00ff) * (argb32 >> 0x18);
    iVar20 = (argb32 >> 8 & 0xff | 0xff0000) * (argb32 >> 0x18);
    uVar28 = (iVar25 + 0x800080U >> 8 & 0xff00ff) + iVar25 + 0x800080 >> 8 & 0xff00ff |
             iVar20 + (iVar20 + 0x800080U >> 8 & 0xff00ff) + 0x800080 & 0xff00ff00;
    auVar33._4_4_ = uVar28;
    auVar33._0_4_ = uVar28;
    auVar33._8_4_ = uVar28;
    auVar33._12_4_ = uVar28;
    auVar35 = pmovzxbw(in_XMM1,auVar33);
    lVar29 = lVar5 * uVar31 + *(long *)(*(long *)(this + 8) + 0x10);
    lVar23 = *(long *)(this + 0x58) * uVar31 * 8 + *(long *)(this + 0x60);
    puVar32 = (ulong *)(*(long *)(this + 0x48) * uVar31 * 8 + *(long *)(this + 0x50));
    auVar43 = pmovzxbw(in_XMM2,0xffffffffffffffff);
    auVar44 = pmovzxbw(in_XMM3,0x8080808080808080);
    auVar46 = pmovzxbw(in_XMM6,0x8080808080808080);
    auVar54 = pmovzxbw(in_XMM8,0xffffffffffffffff);
    do {
      lVar19 = *(long *)(this + 0x48);
      uVar27 = 0;
      uVar16 = 0;
      uVar30 = 0;
      do {
        uVar18 = *puVar32;
        *puVar32 = 0;
        sVar81 = auVar44._0_2_;
        sVar88 = auVar44._2_2_;
        sVar90 = auVar44._4_2_;
        sVar92 = auVar44._6_2_;
        sVar94 = auVar44._8_2_;
        sVar96 = auVar44._10_2_;
        sVar98 = auVar44._12_2_;
        sVar100 = auVar44._14_2_;
        sVar34 = auVar35._0_2_;
        sVar36 = auVar35._2_2_;
        sVar37 = auVar35._4_2_;
        sVar38 = auVar35._6_2_;
        sVar39 = auVar35._8_2_;
        sVar40 = auVar35._10_2_;
        sVar41 = auVar35._12_2_;
        sVar42 = auVar35._14_2_;
        sVar45 = auVar46._0_2_;
        sVar47 = auVar46._2_2_;
        sVar48 = auVar46._4_2_;
        sVar49 = auVar46._6_2_;
        sVar50 = auVar46._8_2_;
        sVar51 = auVar46._10_2_;
        sVar52 = auVar46._12_2_;
        sVar53 = auVar46._14_2_;
        if (uVar18 != 0) {
          do {
            lVar6 = 0;
            if (uVar18 != 0) {
              for (; (uVar18 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
              }
            }
            uVar26 = -1L << ((byte)lVar6 & 0x3f);
            uVar21 = (uint)((int)lVar6 << 2) | uVar30;
            uVar24 = uVar21 - uVar16;
            uVar22 = uVar16;
            if (uVar16 <= uVar21 && uVar24 != 0) {
              uVar63 = -uVar27;
              if (0 < (int)uVar27) {
                uVar63 = uVar27;
              }
              uVar66 = 0xff;
              if ((int)uVar63 < 0xff) {
                uVar66 = uVar63;
              }
              uVar22 = uVar21;
              if (uVar27 != 0) {
                uVar17 = uVar24 >> 2;
                if (uVar63 < 0xff) {
                  auVar69 = pshuflw(ZEXT416(uVar66),ZEXT416(uVar66),0);
                  auVar82._0_4_ = auVar69._0_4_;
                  auVar82._4_4_ = auVar82._0_4_;
                  auVar82._8_4_ = auVar82._0_4_;
                  auVar82._12_4_ = auVar82._0_4_;
                  sVar65 = auVar69._0_2_;
                  sVar77 = auVar69._2_2_;
                  auVar82 = auVar82 ^ auVar43;
                  sVar80 = sVar65 * sVar34 + sVar81;
                  sVar87 = sVar77 * sVar36 + sVar88;
                  sVar89 = sVar65 * sVar37 + sVar90;
                  sVar91 = sVar77 * sVar38 + sVar92;
                  sVar93 = sVar65 * sVar39 + sVar94;
                  sVar95 = sVar77 * sVar40 + sVar96;
                  sVar97 = sVar65 * sVar41 + sVar98;
                  sVar99 = sVar77 * sVar42 + sVar100;
                  sVar55 = auVar82._0_2_;
                  sVar57 = auVar82._2_2_;
                  sVar58 = auVar82._4_2_;
                  sVar59 = auVar82._6_2_;
                  sVar60 = auVar82._8_2_;
                  sVar61 = auVar82._10_2_;
                  sVar62 = auVar82._12_2_;
                  sVar64 = auVar82._14_2_;
                  if (7 < uVar24) {
                    do {
                      auVar69 = *(undefined1 (*) [16])(lVar29 + uVar16 * 4);
                      auVar82 = *(undefined1 (*) [16])(lVar29 + 0x10 + uVar16 * 4);
                      auVar105 = pmovzxbw(in_XMM13,auVar69);
                      auVar115 = pmovzxbw(in_XMM15,auVar82);
                      auVar116._0_2_ = (ushort)auVar69[8] * sVar55 + sVar80;
                      auVar116._2_2_ = (ushort)auVar69[9] * sVar57 + sVar87;
                      auVar116._4_2_ = (ushort)auVar69[10] * sVar58 + sVar89;
                      auVar116._6_2_ = (ushort)auVar69[0xb] * sVar59 + sVar91;
                      auVar116._8_2_ = (ushort)auVar69[0xc] * sVar60 + sVar93;
                      auVar116._10_2_ = (ushort)auVar69[0xd] * sVar61 + sVar95;
                      auVar116._12_2_ = (ushort)auVar69[0xe] * sVar62 + sVar97;
                      auVar116._14_2_ = (ushort)auVar69[0xf] * sVar64 + sVar99;
                      auVar116 = pmulhuw(auVar116,auVar14);
                      auVar69._0_2_ = (ushort)auVar82[8] * sVar55 + sVar80;
                      auVar69._2_2_ = (ushort)auVar82[9] * sVar57 + sVar87;
                      auVar69._4_2_ = (ushort)auVar82[10] * sVar58 + sVar89;
                      auVar69._6_2_ = (ushort)auVar82[0xb] * sVar59 + sVar91;
                      auVar69._8_2_ = (ushort)auVar82[0xc] * sVar60 + sVar93;
                      auVar69._10_2_ = (ushort)auVar82[0xd] * sVar61 + sVar95;
                      auVar69._12_2_ = (ushort)auVar82[0xe] * sVar62 + sVar97;
                      auVar69._14_2_ = (ushort)auVar82[0xf] * sVar64 + sVar99;
                      auVar69 = pmulhuw(auVar69,auVar14);
                      auVar113._0_2_ = auVar105._0_2_ * sVar55 + sVar80;
                      auVar113._2_2_ = auVar105._2_2_ * sVar57 + sVar87;
                      auVar113._4_2_ = auVar105._4_2_ * sVar58 + sVar89;
                      auVar113._6_2_ = auVar105._6_2_ * sVar59 + sVar91;
                      auVar113._8_2_ = auVar105._8_2_ * sVar60 + sVar93;
                      auVar113._10_2_ = auVar105._10_2_ * sVar61 + sVar95;
                      auVar113._12_2_ = auVar105._12_2_ * sVar62 + sVar97;
                      auVar113._14_2_ = auVar105._14_2_ * sVar64 + sVar99;
                      auVar82 = pmulhuw(auVar113,auVar14);
                      sVar7 = auVar82._0_2_;
                      sVar8 = auVar82._2_2_;
                      in_XMM13[1] = (0 < sVar8) * (sVar8 < 0x100) * auVar82[2] - (0xff < sVar8);
                      in_XMM13[0] = (0 < sVar7) * (sVar7 < 0x100) * auVar82[0] - (0xff < sVar7);
                      sVar7 = auVar82._4_2_;
                      in_XMM13[2] = (0 < sVar7) * (sVar7 < 0x100) * auVar82[4] - (0xff < sVar7);
                      sVar7 = auVar82._6_2_;
                      in_XMM13[3] = (0 < sVar7) * (sVar7 < 0x100) * auVar82[6] - (0xff < sVar7);
                      sVar7 = auVar82._8_2_;
                      in_XMM13[4] = (0 < sVar7) * (sVar7 < 0x100) * auVar82[8] - (0xff < sVar7);
                      sVar7 = auVar82._10_2_;
                      in_XMM13[5] = (0 < sVar7) * (sVar7 < 0x100) * auVar82[10] - (0xff < sVar7);
                      sVar7 = auVar82._12_2_;
                      in_XMM13[6] = (0 < sVar7) * (sVar7 < 0x100) * auVar82[0xc] - (0xff < sVar7);
                      sVar7 = auVar82._14_2_;
                      in_XMM13[7] = (0 < sVar7) * (sVar7 < 0x100) * auVar82[0xe] - (0xff < sVar7);
                      sVar7 = auVar116._0_2_;
                      in_XMM13[8] = (0 < sVar7) * (sVar7 < 0x100) * auVar116[0] - (0xff < sVar7);
                      sVar7 = auVar116._2_2_;
                      in_XMM13[9] = (0 < sVar7) * (sVar7 < 0x100) * auVar116[2] - (0xff < sVar7);
                      sVar7 = auVar116._4_2_;
                      in_XMM13[10] = (0 < sVar7) * (sVar7 < 0x100) * auVar116[4] - (0xff < sVar7);
                      sVar7 = auVar116._6_2_;
                      in_XMM13[0xb] = (0 < sVar7) * (sVar7 < 0x100) * auVar116[6] - (0xff < sVar7);
                      sVar7 = auVar116._8_2_;
                      in_XMM13[0xc] = (0 < sVar7) * (sVar7 < 0x100) * auVar116[8] - (0xff < sVar7);
                      sVar7 = auVar116._10_2_;
                      in_XMM13[0xd] = (0 < sVar7) * (sVar7 < 0x100) * auVar116[10] - (0xff < sVar7);
                      sVar7 = auVar116._12_2_;
                      in_XMM13[0xe] = (0 < sVar7) * (sVar7 < 0x100) * auVar116[0xc] - (0xff < sVar7)
                      ;
                      sVar7 = auVar116._14_2_;
                      in_XMM13[0xf] = (0 < sVar7) * (sVar7 < 0x100) * auVar116[0xe] - (0xff < sVar7)
                      ;
                      auVar105._0_2_ = auVar115._0_2_ * sVar55 + sVar80;
                      auVar105._2_2_ = auVar115._2_2_ * sVar57 + sVar87;
                      auVar105._4_2_ = auVar115._4_2_ * sVar58 + sVar89;
                      auVar105._6_2_ = auVar115._6_2_ * sVar59 + sVar91;
                      auVar105._8_2_ = auVar115._8_2_ * sVar60 + sVar93;
                      auVar105._10_2_ = auVar115._10_2_ * sVar61 + sVar95;
                      auVar105._12_2_ = auVar115._12_2_ * sVar62 + sVar97;
                      auVar105._14_2_ = auVar115._14_2_ * sVar64 + sVar99;
                      auVar82 = pmulhuw(auVar105,auVar14);
                      sVar7 = auVar82._0_2_;
                      sVar8 = auVar82._2_2_;
                      in_XMM15[1] = (0 < sVar8) * (sVar8 < 0x100) * auVar82[2] - (0xff < sVar8);
                      in_XMM15[0] = (0 < sVar7) * (sVar7 < 0x100) * auVar82[0] - (0xff < sVar7);
                      sVar7 = auVar82._4_2_;
                      in_XMM15[2] = (0 < sVar7) * (sVar7 < 0x100) * auVar82[4] - (0xff < sVar7);
                      sVar7 = auVar82._6_2_;
                      in_XMM15[3] = (0 < sVar7) * (sVar7 < 0x100) * auVar82[6] - (0xff < sVar7);
                      sVar7 = auVar82._8_2_;
                      in_XMM15[4] = (0 < sVar7) * (sVar7 < 0x100) * auVar82[8] - (0xff < sVar7);
                      sVar7 = auVar82._10_2_;
                      in_XMM15[5] = (0 < sVar7) * (sVar7 < 0x100) * auVar82[10] - (0xff < sVar7);
                      sVar7 = auVar82._12_2_;
                      in_XMM15[6] = (0 < sVar7) * (sVar7 < 0x100) * auVar82[0xc] - (0xff < sVar7);
                      sVar7 = auVar82._14_2_;
                      in_XMM15[7] = (0 < sVar7) * (sVar7 < 0x100) * auVar82[0xe] - (0xff < sVar7);
                      sVar7 = auVar69._0_2_;
                      in_XMM15[8] = (0 < sVar7) * (sVar7 < 0x100) * auVar69[0] - (0xff < sVar7);
                      sVar7 = auVar69._2_2_;
                      in_XMM15[9] = (0 < sVar7) * (sVar7 < 0x100) * auVar69[2] - (0xff < sVar7);
                      sVar7 = auVar69._4_2_;
                      in_XMM15[10] = (0 < sVar7) * (sVar7 < 0x100) * auVar69[4] - (0xff < sVar7);
                      sVar7 = auVar69._6_2_;
                      in_XMM15[0xb] = (0 < sVar7) * (sVar7 < 0x100) * auVar69[6] - (0xff < sVar7);
                      sVar7 = auVar69._8_2_;
                      in_XMM15[0xc] = (0 < sVar7) * (sVar7 < 0x100) * auVar69[8] - (0xff < sVar7);
                      sVar7 = auVar69._10_2_;
                      in_XMM15[0xd] = (0 < sVar7) * (sVar7 < 0x100) * auVar69[10] - (0xff < sVar7);
                      sVar7 = auVar69._12_2_;
                      in_XMM15[0xe] = (0 < sVar7) * (sVar7 < 0x100) * auVar69[0xc] - (0xff < sVar7);
                      sVar7 = auVar69._14_2_;
                      in_XMM15[0xf] = (0 < sVar7) * (sVar7 < 0x100) * auVar69[0xe] - (0xff < sVar7);
                      *(undefined1 (*) [16])(lVar29 + uVar16 * 4) = in_XMM13;
                      *(undefined1 (*) [16])(lVar29 + 0x10 + uVar16 * 4) = in_XMM15;
                      uVar16 = uVar16 + 8;
                      uVar17 = uVar17 - 2;
                    } while (1 < uVar17);
                  }
                  if (uVar17 != 0) {
                    auVar69 = *(undefined1 (*) [16])(lVar29 + uVar16 * 4);
                    auVar82 = pmovzxbw(in_XMM13,auVar69);
                    auVar115._0_2_ = (ushort)auVar69[8] * sVar55 + sVar80;
                    auVar115._2_2_ = (ushort)auVar69[9] * sVar57 + sVar87;
                    auVar115._4_2_ = (ushort)auVar69[10] * sVar58 + sVar89;
                    auVar115._6_2_ = (ushort)auVar69[0xb] * sVar59 + sVar91;
                    auVar115._8_2_ = (ushort)auVar69[0xc] * sVar60 + sVar93;
                    auVar115._10_2_ = (ushort)auVar69[0xd] * sVar61 + sVar95;
                    auVar115._12_2_ = (ushort)auVar69[0xe] * sVar62 + sVar97;
                    auVar115._14_2_ = (ushort)auVar69[0xf] * sVar64 + sVar99;
                    auVar69 = pmulhuw(auVar115,auVar14);
                    auVar104._0_2_ = auVar82._0_2_ * sVar55 + sVar80;
                    auVar104._2_2_ = auVar82._2_2_ * sVar57 + sVar87;
                    auVar104._4_2_ = auVar82._4_2_ * sVar58 + sVar89;
                    auVar104._6_2_ = auVar82._6_2_ * sVar59 + sVar91;
                    auVar104._8_2_ = auVar82._8_2_ * sVar60 + sVar93;
                    auVar104._10_2_ = auVar82._10_2_ * sVar61 + sVar95;
                    auVar104._12_2_ = auVar82._12_2_ * sVar62 + sVar97;
                    auVar104._14_2_ = auVar82._14_2_ * sVar64 + sVar99;
                    auVar82 = pmulhuw(auVar104,auVar14);
                    sVar80 = auVar82._0_2_;
                    sVar87 = auVar82._2_2_;
                    in_XMM13[1] = (0 < sVar87) * (sVar87 < 0x100) * auVar82[2] - (0xff < sVar87);
                    in_XMM13[0] = (0 < sVar80) * (sVar80 < 0x100) * auVar82[0] - (0xff < sVar80);
                    sVar80 = auVar82._4_2_;
                    in_XMM13[2] = (0 < sVar80) * (sVar80 < 0x100) * auVar82[4] - (0xff < sVar80);
                    sVar80 = auVar82._6_2_;
                    in_XMM13[3] = (0 < sVar80) * (sVar80 < 0x100) * auVar82[6] - (0xff < sVar80);
                    sVar80 = auVar82._8_2_;
                    in_XMM13[4] = (0 < sVar80) * (sVar80 < 0x100) * auVar82[8] - (0xff < sVar80);
                    sVar80 = auVar82._10_2_;
                    in_XMM13[5] = (0 < sVar80) * (sVar80 < 0x100) * auVar82[10] - (0xff < sVar80);
                    sVar80 = auVar82._12_2_;
                    in_XMM13[6] = (0 < sVar80) * (sVar80 < 0x100) * auVar82[0xc] - (0xff < sVar80);
                    sVar80 = auVar82._14_2_;
                    in_XMM13[7] = (0 < sVar80) * (sVar80 < 0x100) * auVar82[0xe] - (0xff < sVar80);
                    sVar80 = auVar69._0_2_;
                    in_XMM13[8] = (0 < sVar80) * (sVar80 < 0x100) * auVar69[0] - (0xff < sVar80);
                    sVar80 = auVar69._2_2_;
                    in_XMM13[9] = (0 < sVar80) * (sVar80 < 0x100) * auVar69[2] - (0xff < sVar80);
                    sVar80 = auVar69._4_2_;
                    in_XMM13[10] = (0 < sVar80) * (sVar80 < 0x100) * auVar69[4] - (0xff < sVar80);
                    sVar80 = auVar69._6_2_;
                    in_XMM13[0xb] = (0 < sVar80) * (sVar80 < 0x100) * auVar69[6] - (0xff < sVar80);
                    sVar80 = auVar69._8_2_;
                    in_XMM13[0xc] = (0 < sVar80) * (sVar80 < 0x100) * auVar69[8] - (0xff < sVar80);
                    sVar80 = auVar69._10_2_;
                    in_XMM13[0xd] = (0 < sVar80) * (sVar80 < 0x100) * auVar69[10] - (0xff < sVar80);
                    sVar80 = auVar69._12_2_;
                    in_XMM13[0xe] = (0 < sVar80) * (sVar80 < 0x100) * auVar69[0xc] - (0xff < sVar80)
                    ;
                    sVar80 = auVar69._14_2_;
                    in_XMM13[0xf] = (0 < sVar80) * (sVar80 < 0x100) * auVar69[0xe] - (0xff < sVar80)
                    ;
                    *(undefined1 (*) [16])(lVar29 + uVar16 * 4) = in_XMM13;
                    uVar16 = uVar16 + 4;
                  }
                  if (uVar16 < uVar21) {
                    do {
                      auVar69 = ZEXT416(*(uint *)(lVar29 + uVar16 * 4));
                      auVar69 = pmovzxbw(auVar69,auVar69);
                      auVar85._0_2_ = auVar69._0_2_ * sVar55 + sVar65 * sVar34 + sVar45;
                      auVar85._2_2_ = auVar69._2_2_ * sVar57 + sVar77 * sVar36 + sVar47;
                      auVar85._4_2_ = auVar69._4_2_ * sVar58 + sVar65 * sVar37 + sVar48;
                      auVar85._6_2_ = auVar69._6_2_ * sVar59 + sVar77 * sVar38 + sVar49;
                      auVar85._8_2_ = auVar69._8_2_ * sVar60 + sVar65 * sVar39 + sVar50;
                      auVar85._10_2_ = auVar69._10_2_ * sVar61 + sVar77 * sVar40 + sVar51;
                      auVar85._12_2_ = auVar69._12_2_ * sVar62 + sVar65 * sVar41 + sVar52;
                      auVar85._14_2_ = auVar69._14_2_ * sVar64 + sVar77 * sVar42 + sVar53;
                      auVar69 = pmulhuw(auVar85,auVar15);
                      sVar80 = auVar69._0_2_;
                      sVar87 = auVar69._2_2_;
                      sVar89 = auVar69._4_2_;
                      sVar91 = auVar69._6_2_;
                      *(uint *)(lVar29 + uVar16 * 4) =
                           CONCAT13((0 < sVar91) * (sVar91 < 0x100) * auVar69[6] - (0xff < sVar91),
                                    CONCAT12((0 < sVar89) * (sVar89 < 0x100) * auVar69[4] -
                                             (0xff < sVar89),
                                             CONCAT11((0 < sVar87) * (sVar87 < 0x100) * auVar69[2] -
                                                      (0xff < sVar87),
                                                      (0 < sVar80) * (sVar80 < 0x100) * auVar69[0] -
                                                      (0xff < sVar80))));
                      uVar16 = uVar16 + 1;
                    } while (uVar16 < uVar21);
                  }
                }
                else {
                  if (0x1f < uVar24) {
                    do {
                      *(undefined1 (*) [16])(lVar29 + uVar16 * 4) = auVar33;
                      *(undefined1 (*) [16])(lVar29 + 0x10 + uVar16 * 4) = auVar33;
                      *(undefined1 (*) [16])(lVar29 + 0x20 + uVar16 * 4) = auVar33;
                      *(undefined1 (*) [16])(lVar29 + 0x30 + uVar16 * 4) = auVar33;
                      *(undefined1 (*) [16])(lVar29 + 0x40 + uVar16 * 4) = auVar33;
                      *(undefined1 (*) [16])(lVar29 + 0x50 + uVar16 * 4) = auVar33;
                      *(undefined1 (*) [16])(lVar29 + 0x60 + uVar16 * 4) = auVar33;
                      *(undefined1 (*) [16])(lVar29 + 0x70 + uVar16 * 4) = auVar33;
                      uVar16 = uVar16 + 0x20;
                      uVar17 = uVar17 - 8;
                    } while (7 < uVar17);
                  }
                  for (; uVar17 != 0; uVar17 = uVar17 - 1) {
                    *(undefined1 (*) [16])(lVar29 + uVar16 * 4) = auVar33;
                    uVar16 = uVar16 + 4;
                  }
                  for (; uVar16 < uVar21; uVar16 = uVar16 + 1) {
                    *(uint *)(lVar29 + uVar16 * 4) = uVar28;
                  }
                }
              }
            }
            uVar21 = uVar26 ^ uVar18;
            if (uVar18 == uVar26) {
              uVar16 = (long)*(int *)(this + 0x30);
              if (uVar30 + 0x100 < (ulong)(long)*(int *)(this + 0x30)) {
                uVar16 = uVar30 + 0x100;
              }
            }
            else {
              lVar6 = 0;
              if (uVar21 != 0) {
                for (; (uVar21 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
                }
              }
              uVar21 = -1L << ((byte)lVar6 & 0x3f) ^ uVar21;
              uVar16 = (uint)((int)lVar6 << 2) | uVar30;
            }
            sVar55 = auVar43._0_2_;
            sVar57 = auVar43._2_2_;
            sVar58 = auVar43._4_2_;
            sVar59 = auVar43._6_2_;
            sVar60 = auVar43._8_2_;
            sVar61 = auVar43._10_2_;
            sVar62 = auVar43._12_2_;
            sVar64 = auVar43._14_2_;
            uVar63 = 0;
            if (3 < uVar16 - uVar22) {
              uVar18 = uVar16 - uVar22 >> 2;
              do {
                piVar1 = (int *)(lVar23 + uVar22 * 8);
                iVar20 = *piVar1;
                piVar3 = (int *)(lVar23 + 0x10 + uVar22 * 8);
                iVar108 = iVar20 + piVar1[2];
                auVar13._4_4_ = iVar108;
                auVar13._0_4_ = iVar20;
                auVar68._0_4_ = piVar1[1] >> 9;
                auVar68._4_4_ = piVar1[3] >> 9;
                auVar68._8_4_ = piVar3[1] >> 9;
                auVar68._12_4_ = piVar3[3] >> 9;
                auVar13._8_8_ = 0;
                iVar25 = iVar20 + uVar27;
                iVar109 = iVar108 + uVar27;
                iVar110 = piVar1[2] + *piVar3 + uVar27;
                uVar27 = *piVar3 + piVar3[2] + uVar27 + iVar108;
                auVar103._0_4_ = iVar25 - auVar68._0_4_;
                auVar103._4_4_ = iVar109 - auVar68._4_4_;
                auVar103._8_4_ = (iVar110 + iVar20) - auVar68._8_4_;
                auVar103._12_4_ = uVar27 - auVar68._12_4_;
                auVar69 = pabsd(auVar68,auVar103);
                auVar69 = packssdw(auVar69,auVar69);
                sVar65 = auVar69._0_2_;
                sVar77 = auVar69._2_2_;
                sVar80 = auVar69._4_2_;
                uVar78 = (ushort)(sVar58 < sVar80) * sVar58 | (ushort)(sVar58 >= sVar80) * sVar80;
                sVar80 = auVar69._6_2_;
                uVar79 = (ushort)(sVar59 < sVar80) * sVar59 | (ushort)(sVar59 >= sVar80) * sVar80;
                auVar71._0_8_ =
                     CONCAT26(uVar79,CONCAT24(uVar78,CONCAT22((ushort)(sVar57 < sVar77) * sVar57 |
                                                              (ushort)(sVar57 >= sVar77) * sVar77,
                                                              (ushort)(sVar55 < sVar65) * sVar55 |
                                                              (ushort)(sVar55 >= sVar65) * sVar65)))
                ;
                sVar65 = auVar69._8_2_;
                auVar67._0_10_ =
                     CONCAT28((ushort)(sVar60 < sVar65) * sVar60 |
                              (ushort)(sVar60 >= sVar65) * sVar65,auVar71._0_8_);
                sVar65 = auVar69._10_2_;
                auVar67._10_2_ =
                     (ushort)(sVar61 < sVar65) * sVar61 | (ushort)(sVar61 >= sVar65) * sVar65;
                sVar65 = auVar69._12_2_;
                sVar77 = auVar69._14_2_;
                auVar70._12_2_ =
                     (ushort)(sVar62 < sVar65) * sVar62 | (ushort)(sVar62 >= sVar65) * sVar65;
                auVar70._0_12_ = auVar67;
                auVar70._14_2_ =
                     (ushort)(sVar64 < sVar77) * sVar64 | (ushort)(sVar64 >= sVar77) * sVar77;
                auVar82 = pshuflw(auVar13 << 0x40,auVar70,0x50);
                auVar73._12_2_ = uVar79;
                auVar73._0_12_ = auVar67;
                auVar73._14_2_ = uVar79;
                auVar72._12_4_ = auVar73._12_4_;
                auVar72._10_2_ = uVar78;
                auVar72._0_10_ = auVar67._0_10_;
                auVar71._10_6_ = auVar72._10_6_;
                auVar71._8_2_ = uVar78;
                *(undefined1 (*) [16])(lVar23 + uVar22 * 8) = (undefined1  [16])0x0;
                *(undefined1 (*) [16])(lVar23 + 0x10 + uVar22 * 8) = (undefined1  [16])0x0;
                auVar69 = *(undefined1 (*) [16])(lVar29 + uVar22 * 4);
                in_XMM13 = pmovzxbw(auVar103,auVar69);
                auVar83._0_4_ = auVar82._0_4_;
                auVar83._4_4_ = auVar83._0_4_;
                auVar83._8_4_ = auVar82._4_4_;
                auVar83._12_4_ = auVar82._4_4_;
                auVar74._4_4_ = auVar71._8_4_;
                auVar74._0_4_ = auVar71._8_4_;
                auVar74._8_4_ = auVar72._12_4_;
                auVar74._12_4_ = auVar72._12_4_;
                auVar83 = auVar83 ^ auVar43;
                auVar74 = auVar74 ^ auVar43;
                auVar111._0_2_ = auVar82._0_2_ * sVar34 + sVar81 + auVar83._0_2_ * in_XMM13._0_2_;
                auVar111._2_2_ = auVar82._2_2_ * sVar36 + sVar88 + auVar83._2_2_ * in_XMM13._2_2_;
                auVar111._4_2_ = auVar82._0_2_ * sVar37 + sVar90 + auVar83._4_2_ * in_XMM13._4_2_;
                auVar111._6_2_ = auVar82._2_2_ * sVar38 + sVar92 + auVar83._6_2_ * in_XMM13._6_2_;
                auVar111._8_2_ = auVar82._4_2_ * sVar39 + sVar94 + auVar83._8_2_ * in_XMM13._8_2_;
                auVar111._10_2_ = auVar82._6_2_ * sVar40 + sVar96 + auVar83._10_2_ * in_XMM13._10_2_
                ;
                auVar111._12_2_ = auVar82._4_2_ * sVar41 + sVar98 + auVar83._12_2_ * in_XMM13._12_2_
                ;
                auVar111._14_2_ =
                     auVar82._6_2_ * sVar42 + sVar100 + auVar83._14_2_ * in_XMM13._14_2_;
                auVar82 = pmulhuw(auVar111,auVar14);
                auVar114._0_2_ = uVar78 * sVar34 + sVar81 + auVar74._0_2_ * (ushort)auVar69[8];
                auVar114._2_2_ = uVar78 * sVar36 + sVar88 + auVar74._2_2_ * (ushort)auVar69[9];
                auVar114._4_2_ = uVar78 * sVar37 + sVar90 + auVar74._4_2_ * (ushort)auVar69[10];
                auVar114._6_2_ = uVar78 * sVar38 + sVar92 + auVar74._6_2_ * (ushort)auVar69[0xb];
                auVar114._8_2_ = uVar79 * sVar39 + sVar94 + auVar74._8_2_ * (ushort)auVar69[0xc];
                auVar114._10_2_ = uVar79 * sVar40 + sVar96 + auVar74._10_2_ * (ushort)auVar69[0xd];
                auVar114._12_2_ = uVar79 * sVar41 + sVar98 + auVar74._12_2_ * (ushort)auVar69[0xe];
                auVar114._14_2_ = uVar79 * sVar42 + sVar100 + auVar74._14_2_ * (ushort)auVar69[0xf];
                in_XMM15 = pmulhuw(auVar114,auVar14);
                sVar65 = auVar82._0_2_;
                sVar77 = auVar82._2_2_;
                sVar80 = auVar82._4_2_;
                sVar87 = auVar82._6_2_;
                sVar89 = auVar82._8_2_;
                sVar91 = auVar82._10_2_;
                sVar93 = auVar82._12_2_;
                sVar95 = auVar82._14_2_;
                sVar97 = in_XMM15._0_2_;
                sVar99 = in_XMM15._2_2_;
                sVar7 = in_XMM15._4_2_;
                sVar8 = in_XMM15._6_2_;
                sVar9 = in_XMM15._8_2_;
                sVar10 = in_XMM15._10_2_;
                sVar11 = in_XMM15._12_2_;
                sVar12 = in_XMM15._14_2_;
                pcVar2 = (char *)(lVar29 + uVar22 * 4);
                *pcVar2 = (0 < sVar65) * (sVar65 < 0x100) * auVar82[0] - (0xff < sVar65);
                pcVar2[1] = (0 < sVar77) * (sVar77 < 0x100) * auVar82[2] - (0xff < sVar77);
                pcVar2[2] = (0 < sVar80) * (sVar80 < 0x100) * auVar82[4] - (0xff < sVar80);
                pcVar2[3] = (0 < sVar87) * (sVar87 < 0x100) * auVar82[6] - (0xff < sVar87);
                pcVar2[4] = (0 < sVar89) * (sVar89 < 0x100) * auVar82[8] - (0xff < sVar89);
                pcVar2[5] = (0 < sVar91) * (sVar91 < 0x100) * auVar82[10] - (0xff < sVar91);
                pcVar2[6] = (0 < sVar93) * (sVar93 < 0x100) * auVar82[0xc] - (0xff < sVar93);
                pcVar2[7] = (0 < sVar95) * (sVar95 < 0x100) * auVar82[0xe] - (0xff < sVar95);
                pcVar2[8] = (0 < sVar97) * (sVar97 < 0x100) * in_XMM15[0] - (0xff < sVar97);
                pcVar2[9] = (0 < sVar99) * (sVar99 < 0x100) * in_XMM15[2] - (0xff < sVar99);
                pcVar2[10] = (0 < sVar7) * (sVar7 < 0x100) * in_XMM15[4] - (0xff < sVar7);
                pcVar2[0xb] = (0 < sVar8) * (sVar8 < 0x100) * in_XMM15[6] - (0xff < sVar8);
                pcVar2[0xc] = (0 < sVar9) * (sVar9 < 0x100) * in_XMM15[8] - (0xff < sVar9);
                pcVar2[0xd] = (0 < sVar10) * (sVar10 < 0x100) * in_XMM15[10] - (0xff < sVar10);
                pcVar2[0xe] = (0 < sVar11) * (sVar11 < 0x100) * in_XMM15[0xc] - (0xff < sVar11);
                pcVar2[0xf] = (0 < sVar12) * (sVar12 < 0x100) * in_XMM15[0xe] - (0xff < sVar12);
                uVar22 = uVar22 + 4;
                uVar18 = uVar18 - 1;
                uVar63 = uVar27;
              } while (uVar18 != 0);
            }
            if (uVar22 < uVar16) {
              do {
                uVar27 = uVar27 + *(int *)(lVar23 + uVar22 * 8);
                *(undefined8 *)(lVar23 + uVar22 * 8) = 0;
                uVar66 = *(int *)(lVar23 + 4 + uVar22 * 8) >> 9;
                auVar84._0_4_ = uVar27 - uVar66;
                auVar84._4_4_ = uVar63;
                auVar84._8_4_ = uVar63;
                auVar84._12_4_ = uVar63;
                auVar69 = pabsd(ZEXT416(uVar66),auVar84);
                auVar69 = packssdw(auVar69,auVar69);
                auVar82 = ZEXT416(*(uint *)(lVar29 + uVar22 * 4));
                auVar69 = pshuflw(auVar69,auVar69,0);
                sVar65 = auVar69._0_2_;
                auVar75._0_2_ =
                     (ushort)(sVar55 < sVar65) * sVar55 | (ushort)(sVar55 >= sVar65) * sVar65;
                sVar65 = auVar69._2_2_;
                auVar75._2_2_ =
                     (ushort)(sVar57 < sVar65) * sVar57 | (ushort)(sVar57 >= sVar65) * sVar65;
                sVar65 = auVar69._4_2_;
                auVar75._4_2_ =
                     (ushort)(sVar58 < sVar65) * sVar58 | (ushort)(sVar58 >= sVar65) * sVar65;
                sVar65 = auVar69._6_2_;
                auVar75._6_2_ =
                     (ushort)(sVar59 < sVar65) * sVar59 | (ushort)(sVar59 >= sVar65) * sVar65;
                sVar65 = auVar69._8_2_;
                auVar75._8_2_ =
                     (ushort)(sVar60 < sVar65) * sVar60 | (ushort)(sVar60 >= sVar65) * sVar65;
                sVar65 = auVar69._10_2_;
                auVar75._10_2_ =
                     (ushort)(sVar61 < sVar65) * sVar61 | (ushort)(sVar61 >= sVar65) * sVar65;
                sVar65 = auVar69._12_2_;
                sVar77 = auVar69._14_2_;
                auVar75._12_2_ =
                     (ushort)(sVar62 < sVar65) * sVar62 | (ushort)(sVar62 >= sVar65) * sVar65;
                auVar75._14_2_ =
                     (ushort)(sVar64 < sVar77) * sVar64 | (ushort)(sVar64 >= sVar77) * sVar77;
                auVar82 = pmovzxbw(auVar82,auVar82);
                auVar69 = auVar75 ^ auVar54;
                auVar76._0_2_ = auVar69._0_2_ * auVar82._0_2_ + auVar75._0_2_ * sVar34 + sVar45;
                auVar76._2_2_ = auVar69._2_2_ * auVar82._2_2_ + auVar75._2_2_ * sVar36 + sVar47;
                auVar76._4_2_ = auVar69._4_2_ * auVar82._4_2_ + auVar75._4_2_ * sVar37 + sVar48;
                auVar76._6_2_ = auVar69._6_2_ * auVar82._6_2_ + auVar75._6_2_ * sVar38 + sVar49;
                auVar76._8_2_ = auVar69._8_2_ * auVar82._8_2_ + auVar75._8_2_ * sVar39 + sVar50;
                auVar76._10_2_ = auVar69._10_2_ * auVar82._10_2_ + auVar75._10_2_ * sVar40 + sVar51;
                auVar76._12_2_ = auVar69._12_2_ * auVar82._12_2_ + auVar75._12_2_ * sVar41 + sVar52;
                auVar76._14_2_ = auVar69._14_2_ * auVar82._14_2_ + auVar75._14_2_ * sVar42 + sVar53;
                auVar69 = pmulhuw(auVar76,auVar15);
                sVar65 = auVar69._0_2_;
                sVar77 = auVar69._2_2_;
                sVar80 = auVar69._4_2_;
                sVar87 = auVar69._6_2_;
                *(uint *)(lVar29 + uVar22 * 4) =
                     CONCAT13((0 < sVar87) * (sVar87 < 0x100) * auVar69[6] - (0xff < sVar87),
                              CONCAT12((0 < sVar80) * (sVar80 < 0x100) * auVar69[4] -
                                       (0xff < sVar80),
                                       CONCAT11((0 < sVar77) * (sVar77 < 0x100) * auVar69[2] -
                                                (0xff < sVar77),
                                                (0 < sVar65) * (sVar65 < 0x100) * auVar69[0] -
                                                (0xff < sVar65))));
                uVar22 = uVar22 + 1;
              } while (uVar16 != uVar22);
            }
            uVar18 = uVar21;
          } while (uVar21 != 0);
        }
        uVar30 = uVar30 + 0x100;
        puVar32 = puVar32 + 1;
        lVar19 = lVar19 + -1;
      } while (lVar19 != 0);
      uVar30 = (ulong)*(int *)(this + 0x30);
      uVar18 = uVar30 - uVar16;
      if (uVar16 <= uVar30 && uVar18 != 0) {
        uVar63 = -uVar27;
        if (0 < (int)uVar27) {
          uVar63 = uVar27;
        }
        uVar66 = 0xff;
        if ((int)uVar63 < 0xff) {
          uVar66 = uVar63;
        }
        if (uVar27 != 0) {
          uVar22 = uVar18 >> 2;
          if (uVar63 < 0xff) {
            auVar69 = pshuflw(ZEXT416(uVar66),ZEXT416(uVar66),0);
            auVar56._0_4_ = auVar69._0_4_;
            auVar56._4_4_ = auVar56._0_4_;
            auVar56._8_4_ = auVar56._0_4_;
            auVar56._12_4_ = auVar56._0_4_;
            sVar65 = auVar69._0_2_;
            sVar77 = auVar69._2_2_;
            auVar56 = auVar56 ^ auVar43;
            sVar81 = sVar65 * sVar34 + sVar81;
            sVar88 = sVar77 * sVar36 + sVar88;
            sVar90 = sVar65 * sVar37 + sVar90;
            sVar92 = sVar77 * sVar38 + sVar92;
            sVar94 = sVar65 * sVar39 + sVar94;
            sVar96 = sVar77 * sVar40 + sVar96;
            sVar98 = sVar65 * sVar41 + sVar98;
            sVar100 = sVar77 * sVar42 + sVar100;
            sVar55 = auVar56._0_2_;
            sVar57 = auVar56._2_2_;
            sVar58 = auVar56._4_2_;
            sVar59 = auVar56._6_2_;
            sVar60 = auVar56._8_2_;
            sVar61 = auVar56._10_2_;
            sVar62 = auVar56._12_2_;
            sVar64 = auVar56._14_2_;
            if (7 < uVar18) {
              do {
                auVar69 = *(undefined1 (*) [16])(lVar29 + uVar16 * 4);
                auVar82 = *(undefined1 (*) [16])(lVar29 + 0x10 + uVar16 * 4);
                auVar105 = pmovzxbw(in_XMM13,auVar69);
                auVar116 = pmovzxbw(in_XMM15,auVar82);
                auVar112._0_2_ = (ushort)auVar69[8] * sVar55 + sVar81;
                auVar112._2_2_ = (ushort)auVar69[9] * sVar57 + sVar88;
                auVar112._4_2_ = (ushort)auVar69[10] * sVar58 + sVar90;
                auVar112._6_2_ = (ushort)auVar69[0xb] * sVar59 + sVar92;
                auVar112._8_2_ = (ushort)auVar69[0xc] * sVar60 + sVar94;
                auVar112._10_2_ = (ushort)auVar69[0xd] * sVar61 + sVar96;
                auVar112._12_2_ = (ushort)auVar69[0xe] * sVar62 + sVar98;
                auVar112._14_2_ = (ushort)auVar69[0xf] * sVar64 + sVar100;
                auVar113 = pmulhuw(auVar112,auVar14);
                auVar101._0_2_ = (ushort)auVar82[8] * sVar55 + sVar81;
                auVar101._2_2_ = (ushort)auVar82[9] * sVar57 + sVar88;
                auVar101._4_2_ = (ushort)auVar82[10] * sVar58 + sVar90;
                auVar101._6_2_ = (ushort)auVar82[0xb] * sVar59 + sVar92;
                auVar101._8_2_ = (ushort)auVar82[0xc] * sVar60 + sVar94;
                auVar101._10_2_ = (ushort)auVar82[0xd] * sVar61 + sVar96;
                auVar101._12_2_ = (ushort)auVar82[0xe] * sVar62 + sVar98;
                auVar101._14_2_ = (ushort)auVar82[0xf] * sVar64 + sVar100;
                auVar69 = pmulhuw(auVar101,auVar14);
                auVar106._0_2_ = auVar105._0_2_ * sVar55 + sVar81;
                auVar106._2_2_ = auVar105._2_2_ * sVar57 + sVar88;
                auVar106._4_2_ = auVar105._4_2_ * sVar58 + sVar90;
                auVar106._6_2_ = auVar105._6_2_ * sVar59 + sVar92;
                auVar106._8_2_ = auVar105._8_2_ * sVar60 + sVar94;
                auVar106._10_2_ = auVar105._10_2_ * sVar61 + sVar96;
                auVar106._12_2_ = auVar105._12_2_ * sVar62 + sVar98;
                auVar106._14_2_ = auVar105._14_2_ * sVar64 + sVar100;
                auVar82 = pmulhuw(auVar106,auVar14);
                sVar80 = auVar82._0_2_;
                sVar87 = auVar82._2_2_;
                in_XMM13[1] = (0 < sVar87) * (sVar87 < 0x100) * auVar82[2] - (0xff < sVar87);
                in_XMM13[0] = (0 < sVar80) * (sVar80 < 0x100) * auVar82[0] - (0xff < sVar80);
                sVar80 = auVar82._4_2_;
                in_XMM13[2] = (0 < sVar80) * (sVar80 < 0x100) * auVar82[4] - (0xff < sVar80);
                sVar80 = auVar82._6_2_;
                in_XMM13[3] = (0 < sVar80) * (sVar80 < 0x100) * auVar82[6] - (0xff < sVar80);
                sVar80 = auVar82._8_2_;
                in_XMM13[4] = (0 < sVar80) * (sVar80 < 0x100) * auVar82[8] - (0xff < sVar80);
                sVar80 = auVar82._10_2_;
                in_XMM13[5] = (0 < sVar80) * (sVar80 < 0x100) * auVar82[10] - (0xff < sVar80);
                sVar80 = auVar82._12_2_;
                in_XMM13[6] = (0 < sVar80) * (sVar80 < 0x100) * auVar82[0xc] - (0xff < sVar80);
                sVar80 = auVar82._14_2_;
                in_XMM13[7] = (0 < sVar80) * (sVar80 < 0x100) * auVar82[0xe] - (0xff < sVar80);
                sVar80 = auVar113._0_2_;
                in_XMM13[8] = (0 < sVar80) * (sVar80 < 0x100) * auVar113[0] - (0xff < sVar80);
                sVar80 = auVar113._2_2_;
                in_XMM13[9] = (0 < sVar80) * (sVar80 < 0x100) * auVar113[2] - (0xff < sVar80);
                sVar80 = auVar113._4_2_;
                in_XMM13[10] = (0 < sVar80) * (sVar80 < 0x100) * auVar113[4] - (0xff < sVar80);
                sVar80 = auVar113._6_2_;
                in_XMM13[0xb] = (0 < sVar80) * (sVar80 < 0x100) * auVar113[6] - (0xff < sVar80);
                sVar80 = auVar113._8_2_;
                in_XMM13[0xc] = (0 < sVar80) * (sVar80 < 0x100) * auVar113[8] - (0xff < sVar80);
                sVar80 = auVar113._10_2_;
                in_XMM13[0xd] = (0 < sVar80) * (sVar80 < 0x100) * auVar113[10] - (0xff < sVar80);
                sVar80 = auVar113._12_2_;
                in_XMM13[0xe] = (0 < sVar80) * (sVar80 < 0x100) * auVar113[0xc] - (0xff < sVar80);
                sVar80 = auVar113._14_2_;
                in_XMM13[0xf] = (0 < sVar80) * (sVar80 < 0x100) * auVar113[0xe] - (0xff < sVar80);
                auVar117._0_2_ = auVar116._0_2_ * sVar55 + sVar81;
                auVar117._2_2_ = auVar116._2_2_ * sVar57 + sVar88;
                auVar117._4_2_ = auVar116._4_2_ * sVar58 + sVar90;
                auVar117._6_2_ = auVar116._6_2_ * sVar59 + sVar92;
                auVar117._8_2_ = auVar116._8_2_ * sVar60 + sVar94;
                auVar117._10_2_ = auVar116._10_2_ * sVar61 + sVar96;
                auVar117._12_2_ = auVar116._12_2_ * sVar62 + sVar98;
                auVar117._14_2_ = auVar116._14_2_ * sVar64 + sVar100;
                auVar82 = pmulhuw(auVar117,auVar14);
                sVar80 = auVar82._0_2_;
                sVar87 = auVar82._2_2_;
                in_XMM15[1] = (0 < sVar87) * (sVar87 < 0x100) * auVar82[2] - (0xff < sVar87);
                in_XMM15[0] = (0 < sVar80) * (sVar80 < 0x100) * auVar82[0] - (0xff < sVar80);
                sVar80 = auVar82._4_2_;
                in_XMM15[2] = (0 < sVar80) * (sVar80 < 0x100) * auVar82[4] - (0xff < sVar80);
                sVar80 = auVar82._6_2_;
                in_XMM15[3] = (0 < sVar80) * (sVar80 < 0x100) * auVar82[6] - (0xff < sVar80);
                sVar80 = auVar82._8_2_;
                in_XMM15[4] = (0 < sVar80) * (sVar80 < 0x100) * auVar82[8] - (0xff < sVar80);
                sVar80 = auVar82._10_2_;
                in_XMM15[5] = (0 < sVar80) * (sVar80 < 0x100) * auVar82[10] - (0xff < sVar80);
                sVar80 = auVar82._12_2_;
                in_XMM15[6] = (0 < sVar80) * (sVar80 < 0x100) * auVar82[0xc] - (0xff < sVar80);
                sVar80 = auVar82._14_2_;
                in_XMM15[7] = (0 < sVar80) * (sVar80 < 0x100) * auVar82[0xe] - (0xff < sVar80);
                sVar80 = auVar69._0_2_;
                in_XMM15[8] = (0 < sVar80) * (sVar80 < 0x100) * auVar69[0] - (0xff < sVar80);
                sVar80 = auVar69._2_2_;
                in_XMM15[9] = (0 < sVar80) * (sVar80 < 0x100) * auVar69[2] - (0xff < sVar80);
                sVar80 = auVar69._4_2_;
                in_XMM15[10] = (0 < sVar80) * (sVar80 < 0x100) * auVar69[4] - (0xff < sVar80);
                sVar80 = auVar69._6_2_;
                in_XMM15[0xb] = (0 < sVar80) * (sVar80 < 0x100) * auVar69[6] - (0xff < sVar80);
                sVar80 = auVar69._8_2_;
                in_XMM15[0xc] = (0 < sVar80) * (sVar80 < 0x100) * auVar69[8] - (0xff < sVar80);
                sVar80 = auVar69._10_2_;
                in_XMM15[0xd] = (0 < sVar80) * (sVar80 < 0x100) * auVar69[10] - (0xff < sVar80);
                sVar80 = auVar69._12_2_;
                in_XMM15[0xe] = (0 < sVar80) * (sVar80 < 0x100) * auVar69[0xc] - (0xff < sVar80);
                sVar80 = auVar69._14_2_;
                in_XMM15[0xf] = (0 < sVar80) * (sVar80 < 0x100) * auVar69[0xe] - (0xff < sVar80);
                *(undefined1 (*) [16])(lVar29 + uVar16 * 4) = in_XMM13;
                *(undefined1 (*) [16])(lVar29 + 0x10 + uVar16 * 4) = in_XMM15;
                uVar16 = uVar16 + 8;
                uVar22 = uVar22 - 2;
              } while (1 < uVar22);
            }
            if (uVar22 != 0) {
              auVar69 = *(undefined1 (*) [16])(lVar29 + uVar16 * 4);
              auVar82 = pmovzxbw(in_XMM13,auVar69);
              auVar102._0_2_ = (ushort)auVar69[8] * sVar55 + sVar81;
              auVar102._2_2_ = (ushort)auVar69[9] * sVar57 + sVar88;
              auVar102._4_2_ = (ushort)auVar69[10] * sVar58 + sVar90;
              auVar102._6_2_ = (ushort)auVar69[0xb] * sVar59 + sVar92;
              auVar102._8_2_ = (ushort)auVar69[0xc] * sVar60 + sVar94;
              auVar102._10_2_ = (ushort)auVar69[0xd] * sVar61 + sVar96;
              auVar102._12_2_ = (ushort)auVar69[0xe] * sVar62 + sVar98;
              auVar102._14_2_ = (ushort)auVar69[0xf] * sVar64 + sVar100;
              auVar69 = pmulhuw(auVar102,auVar14);
              auVar107._0_2_ = auVar82._0_2_ * sVar55 + sVar81;
              auVar107._2_2_ = auVar82._2_2_ * sVar57 + sVar88;
              auVar107._4_2_ = auVar82._4_2_ * sVar58 + sVar90;
              auVar107._6_2_ = auVar82._6_2_ * sVar59 + sVar92;
              auVar107._8_2_ = auVar82._8_2_ * sVar60 + sVar94;
              auVar107._10_2_ = auVar82._10_2_ * sVar61 + sVar96;
              auVar107._12_2_ = auVar82._12_2_ * sVar62 + sVar98;
              auVar107._14_2_ = auVar82._14_2_ * sVar64 + sVar100;
              auVar82 = pmulhuw(auVar107,auVar14);
              sVar81 = auVar82._0_2_;
              sVar88 = auVar82._2_2_;
              in_XMM13[1] = (0 < sVar88) * (sVar88 < 0x100) * auVar82[2] - (0xff < sVar88);
              in_XMM13[0] = (0 < sVar81) * (sVar81 < 0x100) * auVar82[0] - (0xff < sVar81);
              sVar81 = auVar82._4_2_;
              in_XMM13[2] = (0 < sVar81) * (sVar81 < 0x100) * auVar82[4] - (0xff < sVar81);
              sVar81 = auVar82._6_2_;
              in_XMM13[3] = (0 < sVar81) * (sVar81 < 0x100) * auVar82[6] - (0xff < sVar81);
              sVar81 = auVar82._8_2_;
              in_XMM13[4] = (0 < sVar81) * (sVar81 < 0x100) * auVar82[8] - (0xff < sVar81);
              sVar81 = auVar82._10_2_;
              in_XMM13[5] = (0 < sVar81) * (sVar81 < 0x100) * auVar82[10] - (0xff < sVar81);
              sVar81 = auVar82._12_2_;
              in_XMM13[6] = (0 < sVar81) * (sVar81 < 0x100) * auVar82[0xc] - (0xff < sVar81);
              sVar81 = auVar82._14_2_;
              in_XMM13[7] = (0 < sVar81) * (sVar81 < 0x100) * auVar82[0xe] - (0xff < sVar81);
              sVar81 = auVar69._0_2_;
              in_XMM13[8] = (0 < sVar81) * (sVar81 < 0x100) * auVar69[0] - (0xff < sVar81);
              sVar81 = auVar69._2_2_;
              in_XMM13[9] = (0 < sVar81) * (sVar81 < 0x100) * auVar69[2] - (0xff < sVar81);
              sVar81 = auVar69._4_2_;
              in_XMM13[10] = (0 < sVar81) * (sVar81 < 0x100) * auVar69[4] - (0xff < sVar81);
              sVar81 = auVar69._6_2_;
              in_XMM13[0xb] = (0 < sVar81) * (sVar81 < 0x100) * auVar69[6] - (0xff < sVar81);
              sVar81 = auVar69._8_2_;
              in_XMM13[0xc] = (0 < sVar81) * (sVar81 < 0x100) * auVar69[8] - (0xff < sVar81);
              sVar81 = auVar69._10_2_;
              in_XMM13[0xd] = (0 < sVar81) * (sVar81 < 0x100) * auVar69[10] - (0xff < sVar81);
              sVar81 = auVar69._12_2_;
              in_XMM13[0xe] = (0 < sVar81) * (sVar81 < 0x100) * auVar69[0xc] - (0xff < sVar81);
              sVar81 = auVar69._14_2_;
              in_XMM13[0xf] = (0 < sVar81) * (sVar81 < 0x100) * auVar69[0xe] - (0xff < sVar81);
              *(undefined1 (*) [16])(lVar29 + uVar16 * 4) = in_XMM13;
              uVar16 = uVar16 + 4;
            }
            if (uVar16 < uVar30) {
              do {
                auVar69 = ZEXT416(*(uint *)(lVar29 + uVar16 * 4));
                auVar69 = pmovzxbw(auVar69,auVar69);
                auVar86._0_2_ = auVar69._0_2_ * sVar55 + sVar65 * sVar34 + sVar45;
                auVar86._2_2_ = auVar69._2_2_ * sVar57 + sVar77 * sVar36 + sVar47;
                auVar86._4_2_ = auVar69._4_2_ * sVar58 + sVar65 * sVar37 + sVar48;
                auVar86._6_2_ = auVar69._6_2_ * sVar59 + sVar77 * sVar38 + sVar49;
                auVar86._8_2_ = auVar69._8_2_ * sVar60 + sVar65 * sVar39 + sVar50;
                auVar86._10_2_ = auVar69._10_2_ * sVar61 + sVar77 * sVar40 + sVar51;
                auVar86._12_2_ = auVar69._12_2_ * sVar62 + sVar65 * sVar41 + sVar52;
                auVar86._14_2_ = auVar69._14_2_ * sVar64 + sVar77 * sVar42 + sVar53;
                auVar69 = pmulhuw(auVar86,auVar15);
                sVar81 = auVar69._0_2_;
                sVar88 = auVar69._2_2_;
                sVar90 = auVar69._4_2_;
                sVar92 = auVar69._6_2_;
                *(uint *)(lVar29 + uVar16 * 4) =
                     CONCAT13((0 < sVar92) * (sVar92 < 0x100) * auVar69[6] - (0xff < sVar92),
                              CONCAT12((0 < sVar90) * (sVar90 < 0x100) * auVar69[4] -
                                       (0xff < sVar90),
                                       CONCAT11((0 < sVar88) * (sVar88 < 0x100) * auVar69[2] -
                                                (0xff < sVar88),
                                                (0 < sVar81) * (sVar81 < 0x100) * auVar69[0] -
                                                (0xff < sVar81))));
                uVar16 = uVar16 + 1;
              } while (uVar30 != uVar16);
            }
          }
          else {
            if (0x1f < uVar18) {
              do {
                *(undefined1 (*) [16])(lVar29 + uVar16 * 4) = auVar33;
                *(undefined1 (*) [16])(lVar29 + 0x10 + uVar16 * 4) = auVar33;
                *(undefined1 (*) [16])(lVar29 + 0x20 + uVar16 * 4) = auVar33;
                *(undefined1 (*) [16])(lVar29 + 0x30 + uVar16 * 4) = auVar33;
                *(undefined1 (*) [16])(lVar29 + 0x40 + uVar16 * 4) = auVar33;
                *(undefined1 (*) [16])(lVar29 + 0x50 + uVar16 * 4) = auVar33;
                *(undefined1 (*) [16])(lVar29 + 0x60 + uVar16 * 4) = auVar33;
                *(undefined1 (*) [16])(lVar29 + 0x70 + uVar16 * 4) = auVar33;
                uVar16 = uVar16 + 0x20;
                uVar22 = uVar22 - 8;
              } while (7 < uVar22);
            }
            for (; uVar22 != 0; uVar22 = uVar22 - 1) {
              *(undefined1 (*) [16])(lVar29 + uVar16 * 4) = auVar33;
              uVar16 = uVar16 + 4;
            }
            if (uVar16 < uVar30) {
              do {
                *(uint *)(lVar29 + uVar16 * 4) = uVar28;
                uVar16 = uVar16 + 1;
              } while (uVar30 != uVar16);
            }
          }
        }
      }
      lVar29 = lVar29 + lVar5;
      lVar23 = lVar23 + *(long *)(this + 0x58) * 8;
      uVar31 = uVar31 + 1;
    } while (uVar31 <= (ulong)(long)(int)uVar4);
  }
  *(undefined8 *)(this + 0x40) = 0x7fffffff;
  return;
}

Assistant:

inline void RasterizerA3<N>::_renderImpl(uint32_t argb32) noexcept {
  uint8_t* dstLine = _dst->data();
  intptr_t dstStride = _dst->stride();

  size_t y0 = size_t(_yBounds.start);
  size_t y1 = size_t(_yBounds.end);

  BitWord* bitPtr = _bits + y0 * _bitStride;
  Cell* cellLine = _cells + y0 * _cellStride;

  Compositor compositor(argb32);
  dstLine += y0 * dstStride;

  while (y0 <= y1) {
    size_t nBits = size_t(_bitStride);

    Cell* cell = cellLine;
    uint32_t* dstPix = reinterpret_cast<uint32_t*>(dstLine);

    int cover = 0;
    size_t x0 = 0;
    size_t xOffset = 0;

    do {
      IntUtils::BitWordFlipIterator<BitWord> it(*bitPtr);
      *bitPtr = 0;

      while (it.hasNext()) {
        size_t x1 = xOffset + it.nextAndFlip() * kPixelsPerOneBit;
        if (x0 < x1) {
          uint32_t mask = CompositeUtils::calcMask<NonZero>(cover);
          if (mask)
            compositor.cmask(dstPix, x0, x1, mask);
          x0 = x1;
        }

        if (it.hasNext())
          x1 = xOffset + it.nextAndFlip() * kPixelsPerOneBit;
        else
          x1 = std::min<size_t>(_width, xOffset + kPixelsPerBitWord);

        compositor.template vmask<NonZero>(dstPix, x0, x1, cell, cover);
        x0 = x1;
      }

      xOffset += kPixelsPerBitWord;
      bitPtr++;
    } while (--nBits);

    if (x0 < _width) {
      uint32_t mask = CompositeUtils::calcMask<NonZero>(cover);
      if (mask)
        compositor.cmask(dstPix, x0, _width, mask);
    }

    dstLine += dstStride;
    cellLine += _cellStride;
    y0++;
  }

  _yBounds.reset();
}